

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void algorithm_suite::move_sequence(void)

{
  double dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  double dVar4;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> input;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  double local_38 [5];
  
  local_38[2] = 3.0;
  local_38[3] = 4.0;
  local_38[0] = 1.0;
  local_38[1] = 2.0;
  local_38[4] = 5.0;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector(&local_50,__l,(allocator_type *)&local_58);
  local_38[0] = (double)((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3);
  if ((long)local_38[0] < 1) {
    dVar4 = 0.0;
    local_38[0] = 0.0;
  }
  else {
    dVar4 = 0.0;
    dVar1 = 4.94065645841247e-324;
    do {
      auVar3._8_4_ = (int)((ulong)dVar1 >> 0x20);
      auVar3._0_8_ = dVar1;
      auVar3._12_4_ = 0x45300000;
      dVar4 = (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(long)dVar1 + -1] - dVar4) /
              ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0)) + dVar4;
      bVar2 = dVar1 != local_38[0];
      dVar1 = (double)((long)dVar1 + 1);
    } while (bVar2);
  }
  local_58 = CONCAT44(local_58._4_4_,5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2ee,"void algorithm_suite::move_sequence()",local_38,(allocator_type *)&local_58,
             dVar4);
  local_58 = 0x4008000000000000;
  local_38[0] = dVar4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2ef,"void algorithm_suite::move_sequence()",local_38,(allocator_type *)&local_58);
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void move_sequence()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0, 5.0 };
    cumulative::moment<double> filter;
    std::move(input.begin(), input.end(), push_inserter(filter));
    TRIAL_TEST_EQ(filter.size(), 5);
    TRIAL_TEST_EQ(filter.mean(), 3.0);
}